

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_secret_types.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBSecretTypesInit(ClientContext *context,TableFunctionInitInput *input)

{
  SecretManager *this;
  pointer pDVar1;
  _Head_base<0UL,_duckdb::DuckDBSecretTypesData_*,_false> local_30;
  vector<duckdb::SecretType,_std::allocator<duckdb::SecretType>_> local_28;
  
  make_uniq<duckdb::DuckDBSecretTypesData>();
  this = SecretManager::Get((ClientContext *)input);
  SecretManager::AllSecretTypes((vector<duckdb::SecretType,_true> *)&local_28,this);
  pDVar1 = unique_ptr<duckdb::DuckDBSecretTypesData,_std::default_delete<duckdb::DuckDBSecretTypesData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBSecretTypesData,_std::default_delete<duckdb::DuckDBSecretTypesData>,_true>
                         *)&local_30);
  ::std::vector<duckdb::SecretType,_std::allocator<duckdb::SecretType>_>::_M_move_assign
            (&(pDVar1->types).super_vector<duckdb::SecretType,_std::allocator<duckdb::SecretType>_>,
             &local_28);
  ::std::vector<duckdb::SecretType,_std::allocator<duckdb::SecretType>_>::~vector(&local_28);
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_30._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBSecretTypesInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBSecretTypesData>();

	auto &secret_manager = SecretManager::Get(context);
	result->types = secret_manager.AllSecretTypes();

	return std::move(result);
}